

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode Curl_conn_tcp_listen_set(Curl_easy *data,connectdata *conn,int sockindex,curl_socket_t *s)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  uint *ctx;
  CURLcode CVar3;
  curltime cVar4;
  Curl_cfilter *cf;
  Curl_cfilter *local_38;
  
  local_38 = (Curl_cfilter *)0x0;
  Curl_conn_cf_discard_all(data,conn,sockindex);
  ctx = (uint *)(*Curl_ccalloc)(1,0x138);
  if (ctx == (uint *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *ctx = (uint)conn->transport;
    ctx[0x26] = *s;
    *(byte *)(ctx + 0x4d) = (byte)ctx[0x4d] & 0xf9 | 2;
    CVar2 = Curl_cf_create(&local_38,&Curl_cft_tcp_accept,ctx);
    if (CVar2 == CURLE_OK) {
      Curl_conn_cf_add(data,conn,sockindex,local_38);
      conn->sock[sockindex] = ctx[0x26];
      set_local_ip(local_38,data);
      *(byte *)(ctx + 0x4d) = (byte)ctx[0x4d] | 0x10;
      cVar4 = Curl_now();
      *(time_t *)(ctx + 0x44) = cVar4.tv_sec;
      ctx[0x46] = cVar4.tv_usec;
      local_38->field_0x24 = local_38->field_0x24 | 1;
      CVar3 = CURLE_OK;
      CVar2 = CURLE_OK;
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar1 = (data->state).feat;
        CVar2 = CVar3;
        if (pcVar1 == (curl_trc_feat *)0x0) {
          if (local_38 == (Curl_cfilter *)0x0) goto LAB_0011708a;
        }
        else if ((local_38 == (Curl_cfilter *)0x0) || (pcVar1->log_level < 1)) goto LAB_0011708a;
        if (0 < local_38->cft->log_level) {
          Curl_trc_cf_infof(data,local_38,"Curl_conn_tcp_listen_set(%d)",(ulong)ctx[0x26]);
          CVar2 = CURLE_OK;
        }
      }
    }
  }
LAB_0011708a:
  if (CVar2 != CURLE_OK) {
    (*Curl_cfree)(local_38);
    local_38 = (Curl_cfilter *)0x0;
    (*Curl_cfree)(ctx);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_conn_tcp_listen_set(struct Curl_easy *data,
                                  struct connectdata *conn,
                                  int sockindex, curl_socket_t *s)
{
  CURLcode result;
  struct Curl_cfilter *cf = NULL;
  struct cf_socket_ctx *ctx = NULL;

  /* replace any existing */
  Curl_conn_cf_discard_all(data, conn, sockindex);
  DEBUGASSERT(conn->sock[sockindex] == CURL_SOCKET_BAD);

  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
  ctx->transport = conn->transport;
  ctx->sock = *s;
  ctx->listening = TRUE;
  ctx->accepted = FALSE;
  result = Curl_cf_create(&cf, &Curl_cft_tcp_accept, ctx);
  if(result)
    goto out;
  Curl_conn_cf_add(data, conn, sockindex, cf);

  conn->sock[sockindex] = ctx->sock;
  set_local_ip(cf, data);
  ctx->active = TRUE;
  ctx->connected_at = Curl_now();
  cf->connected = TRUE;
  CURL_TRC_CF(data, cf, "Curl_conn_tcp_listen_set(%" FMT_SOCKET_T ")",
              ctx->sock);

out:
  if(result) {
    Curl_safefree(cf);
    Curl_safefree(ctx);
  }
  return result;
}